

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  ostream *poVar3;
  pointer ppTVar4;
  TimeInMillis ms;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *extraout_RDX_01;
  TestResult *result;
  long lVar5;
  uint uVar6;
  long lVar7;
  undefined1 local_98 [8];
  string kTestsuite;
  string local_58;
  int local_34;
  
  local_98 = (undefined1  [8])&kTestsuite._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"testsuite","");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  <",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(char *)local_98,(long)kTestsuite._M_dataplus._M_p);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"name","");
  std::__cxx11::string::string
            ((string *)(kTestsuite.field_2._M_local_buf + 8),(test_case->name_)._M_dataplus._M_p,
             (allocator *)&local_34);
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"tests","");
  local_34 = 0;
  for (ppTVar4 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar4 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar4 = ppTVar4 + 1) {
    local_34 = local_34 + (uint)(*ppTVar4)->matches_filter_;
  }
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_34);
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failures","");
  local_34 = TestCase::failed_test_count(test_case);
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_34);
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"disabled","");
  local_34 = 0;
  for (ppTVar4 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar4 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar4 = ppTVar4 + 1) {
    uVar6 = 0;
    if ((*ppTVar4)->matches_filter_ == true) {
      uVar6 = (uint)(*ppTVar4)->is_disabled_;
    }
    local_34 = local_34 + uVar6;
  }
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_34);
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"errors","");
  kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kTestsuite.field_2 + 8),"0","");
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_case->elapsed_time_,ms);
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuite.field_2 + 8));
  result = extraout_RDX;
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
    result = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
    result = extraout_RDX_01;
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_58,(XmlUnitTestResultPrinter *)&test_case->ad_hoc_test_result_,result);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  ppTVar4 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(test_case->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
    lVar7 = 0;
    do {
      piVar2 = (test_case->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)(int)((ulong)((long)(test_case->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
      uVar6 = 0xffffffff;
      if (lVar7 < lVar5) {
        uVar6 = piVar2[lVar7];
      }
      if (ppTVar4[uVar6]->matches_filter_ == true) {
        uVar6 = 0xffffffff;
        if (lVar7 < lVar5) {
          uVar6 = piVar2[lVar7];
        }
        OutputXmlTestInfo(stream,(test_case->name_)._M_dataplus._M_p,ppTVar4[uVar6]);
      }
      lVar7 = lVar7 + 1;
      ppTVar4 = (test_case->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(test_case->test_info_list_).
                                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4)
                          >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  </",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_98,(long)kTestsuite._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">\n",2);
  if (local_98 != (undefined1  [8])&kTestsuite._M_string_length) {
    operator_delete((void *)local_98);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "failures",
                     StreamableToString(test_case.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuite, "disabled",
      StreamableToString(test_case.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "errors", "0");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
  *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result())
          << ">\n";

  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}